

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferCopyTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::SingleBufferCopyCase::iterate(SingleBufferCopyCase *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RenderContext *renderCtx;
  byte bVar4;
  byte bVar5;
  deUint32 dVar6;
  deUint32 buffer;
  deUint32 dVar7;
  GLenum GVar8;
  uint uVar9;
  TestLog *log;
  char *pcVar10;
  deUint8 *pdVar11;
  deUint8 *pdVar12;
  int copySize;
  int dstOffset;
  int srcOffset;
  int ndx;
  bool isOk;
  deUint32 baseSeed;
  deUint32 buf;
  undefined1 local_38 [8];
  ReferenceBuffer ref;
  BufferVerifier verifier;
  int size;
  SingleBufferCopyCase *this_local;
  
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier
            ((BufferVerifier *)
             &ref.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,renderCtx,log,this->m_verifyType);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)local_38);
  pcVar10 = tcu::TestNode::getName((TestNode *)this);
  dVar6 = deStringHash(pcVar10);
  bVar5 = 1;
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)local_38,1000);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,buffer);
  dstOffset = 0;
  while( true ) {
    bVar4 = 0;
    if (dstOffset < 4) {
      bVar4 = bVar5;
    }
    if (bVar4 == 0) break;
    iVar1 = iterate::copyRanges[dstOffset].srcOffset;
    iVar2 = iterate::copyRanges[dstOffset].dstOffset;
    iVar3 = iterate::copyRanges[dstOffset].copySize;
    pdVar11 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    dVar7 = ::deInt32Hash(dstOffset);
    deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar11,1000,dVar6 ^ dVar7);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,buffer);
    GVar8 = this->m_srcTarget;
    pdVar11 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_BufferCase).super_CallLogWrapper,GVar8,1000,pdVar11,this->m_hint);
    GVar8 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
    glu::checkError(GVar8,"glBufferData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                    ,0xcc);
    pdVar11 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    pdVar12 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    ::deMemcpy(pdVar11 + iVar2,pdVar12 + iVar1,(long)iVar3);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_BufferCase).super_CallLogWrapper,this->m_dstTarget,buffer);
    glu::CallLogWrapper::glCopyBufferSubData
              (&(this->super_BufferCase).super_CallLogWrapper,this->m_srcTarget,this->m_dstTarget,
               (long)iVar1,(long)iVar2,(long)iVar3);
    GVar8 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
    glu::checkError(GVar8,"glCopyBufferSubData",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferCopyTests.cpp"
                    ,0xd3);
    pdVar11 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)local_38,0);
    uVar9 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                      ((BufferVerifier *)
                       &ref.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (EVP_PKEY_CTX *)(ulong)buffer,pdVar11,0,(uchar *)0x3e8,
                       (ulong)this->m_dstTarget);
    if ((uVar9 & 1) == 0) {
      bVar5 = 0;
    }
    dstOffset = dstOffset + 1;
  }
  pcVar10 = "Buffer verification failed";
  if (bVar5 != 0) {
    pcVar10 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar5,
             pcVar10);
  deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)local_38);
  deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier
            ((BufferVerifier *)
             &ref.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const int		size		= 1000;
		BufferVerifier	verifier	(m_renderCtx, m_testCtx.getLog(), m_verifyType);
		ReferenceBuffer	ref;
		deUint32		buf			= 0;
		deUint32		baseSeed	= deStringHash(getName());
		bool			isOk		= true;

		ref.setSize(size);

		// Create buffer.
		buf = genBuffer();
		glBindBuffer(m_srcTarget, buf);

		static const struct
		{
			int				srcOffset;
			int				dstOffset;
			int				copySize;
		} copyRanges[] =
		{
			{ 57,		701,	101 },	// Non-adjecent, from low to high.
			{ 640,		101,	101 },	// Non-adjecent, from high to low.
			{ 0,		500,	500 },	// Lower half to upper half.
			{ 500,		0,		500 }	// Upper half to lower half.
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(copyRanges) && isOk; ndx++)
		{
			int	srcOffset	= copyRanges[ndx].srcOffset;
			int	dstOffset	= copyRanges[ndx].dstOffset;
			int	copySize	= copyRanges[ndx].copySize;

			fillWithRandomBytes(ref.getPtr(), size, baseSeed ^ deInt32Hash(ndx));

			// Fill with data.
			glBindBuffer(m_srcTarget, buf);
			glBufferData(m_srcTarget, size, ref.getPtr(), m_hint);
			GLU_CHECK_MSG("glBufferData");

			// Execute copy.
			deMemcpy(ref.getPtr()+dstOffset, ref.getPtr()+srcOffset, copySize);

			glBindBuffer(m_dstTarget, buf);
			glCopyBufferSubData(m_srcTarget, m_dstTarget, srcOffset, dstOffset, copySize);
			GLU_CHECK_MSG("glCopyBufferSubData");

			// Verify buffer after copy.
			isOk = verifier.verify(buf, ref.getPtr(), 0, size, m_dstTarget) && isOk;
		}

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}